

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Material.h
# Opt level: O0

void __thiscall
Material::Material(Material *this,Vector3f *diffuseColor,Vector3f *specularColor,
                  Vector3f *transColor,Vector3f *light,float shininess,float refIndex)

{
  float refIndex_local;
  float shininess_local;
  Vector3f *light_local;
  Vector3f *transColor_local;
  Vector3f *specularColor_local;
  Vector3f *diffuseColor_local;
  Material *this_local;
  
  Vector3f::Vector3f(&this->_diffuseColor,diffuseColor);
  Vector3f::Vector3f(&this->_specularColor,specularColor);
  Vector3f::Vector3f(&this->_transColor,transColor);
  Vector3f::Vector3f(&this->_light,light);
  this->_shininess = shininess;
  this->_refIndex = refIndex;
  return;
}

Assistant:

Material(const Vector3f &diffuseColor,
             const Vector3f &specularColor = Vector3f::ZERO,
             const Vector3f &transColor = Vector3f::ZERO,
             const Vector3f &light = Vector3f::ZERO,
             float shininess = 1,
             float refIndex = 0
    ) :
            _diffuseColor(diffuseColor),
            _specularColor(specularColor),
            _shininess(shininess),
            _light(light),
            _transColor(transColor),
            _refIndex(refIndex) {}